

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string *string_path_local;
  ExtPrivkey *this_local;
  
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)string_path;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_58,"ExtPrivkey",&local_59);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,string_path,
                    &local_58,(this->super_Extkey).depth_);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  DerivePrivkey(__return_storage_ptr__,this,
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)string_path);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(const std::string& string_path) const {
  std::vector<uint32_t> path =
      ToArrayFromString(string_path, "ExtPrivkey", depth_);
  return DerivePrivkey(path);
}